

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3NodeAddTerm(Fts3Table *p,SegmentNode **ppTree,int isCopyTerm,char *zTerm,int nTerm)

{
  uint uVar1;
  SegmentNode *pSVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  uchar *q_1;
  ulong uVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  byte *pbVar13;
  SegmentNode *pSVar14;
  undefined4 in_register_00000014;
  void *__src;
  size_t __n;
  u64 nBytes;
  int n;
  uchar *q;
  int iVar15;
  SegmentNode *pNew;
  SegmentNode *pParent;
  SegmentNode *local_40;
  SegmentNode *local_38;
  
  pcVar11 = (char *)(ulong)(uint)nTerm;
  __src = (void *)CONCAT44(in_register_00000014,isCopyTerm);
  pSVar2 = *ppTree;
  if (pSVar2 != (SegmentNode *)0x0) {
    iVar15 = pSVar2->nData;
    pcVar11 = pSVar2->zTerm;
    uVar1 = pSVar2->nTerm;
    uVar9 = 0;
    uVar12 = uVar9;
    if (0 < (int)uVar1) {
      do {
        uVar12 = uVar9;
        if (pcVar11[uVar9] != *(char *)((long)__src + uVar9)) break;
        uVar9 = uVar9 + 1;
        uVar12 = (ulong)uVar1;
      } while (uVar1 != uVar9);
    }
    iVar7 = (int)uVar12;
    uVar9 = (ulong)iVar7;
    iVar4 = (int)zTerm;
    n = (iVar4 + iVar15) - iVar7;
    uVar12 = uVar9;
    do {
      n = n + 1;
      bVar3 = 0x7f < uVar12;
      uVar12 = uVar12 >> 7;
    } while (bVar3);
    __n = (size_t)(iVar4 - iVar7);
    sVar10 = __n;
    do {
      n = n + 1;
      bVar3 = 0x7f < sVar10;
      sVar10 = sVar10 >> 7;
    } while (bVar3);
    iVar8 = p->nNodeSize;
    if (iVar8 < n) {
      if (pcVar11 != (char *)0x0) goto LAB_001c2d08;
      pcVar11 = (char *)sqlite3_malloc(n);
      pSVar2->aData = pcVar11;
      if (pcVar11 == (char *)0x0) {
        return 7;
      }
      pcVar11 = pSVar2->zTerm;
    }
    if (pcVar11 != (char *)0x0) {
      uVar12 = uVar9;
      pbVar6 = (byte *)(pSVar2->aData + iVar15);
      do {
        pbVar13 = pbVar6;
        bVar5 = (byte)uVar12;
        *pbVar13 = bVar5 | 0x80;
        iVar15 = iVar15 + 1;
        bVar3 = 0x7f < uVar12;
        uVar12 = uVar12 >> 7;
        pbVar6 = pbVar13 + 1;
      } while (bVar3);
      *pbVar13 = bVar5;
    }
    pbVar6 = (byte *)(pSVar2->aData + iVar15);
    sVar10 = __n;
    do {
      pbVar13 = pbVar6;
      bVar5 = (byte)sVar10;
      *pbVar13 = bVar5 | 0x80;
      iVar15 = iVar15 + 1;
      bVar3 = 0x7f < sVar10;
      pbVar6 = pbVar13 + 1;
      sVar10 = sVar10 >> 7;
    } while (bVar3);
    *pbVar13 = bVar5;
    memcpy(pSVar2->aData + iVar15,(void *)(uVar9 + (long)__src),__n);
    pSVar2->nData = iVar15 + (iVar4 - iVar7);
    pSVar2->nEntry = pSVar2->nEntry + 1;
    pcVar11 = pSVar2->zMalloc;
    if (pSVar2->nMalloc < iVar4) {
      iVar8 = sqlite3_initialize();
      if (iVar8 != 0) {
        return 7;
      }
      uVar1 = iVar4 * 2;
      nBytes = 0;
      if (0 < (int)uVar1) {
        nBytes = (u64)uVar1;
      }
      pcVar11 = (char *)sqlite3Realloc(pcVar11,nBytes);
      if (pcVar11 == (char *)0x0) {
        return 7;
      }
      pSVar2->nMalloc = uVar1;
      pSVar2->zMalloc = pcVar11;
    }
    pSVar2->zTerm = pcVar11;
    memcpy(pcVar11,__src,(long)iVar4);
    pSVar2->nTerm = iVar4;
    return 0;
  }
  iVar8 = p->nNodeSize;
LAB_001c2d08:
  iVar15 = (int)pcVar11;
  pSVar14 = (SegmentNode *)sqlite3_malloc(iVar8 + 0x48);
  if (pSVar14 == (SegmentNode *)0x0) {
    return 7;
  }
  pSVar14->zMalloc = (char *)0x0;
  *(undefined8 *)&pSVar14->nData = 0;
  pSVar14->zTerm = (char *)0x0;
  pSVar14->nTerm = 0;
  pSVar14->nMalloc = 0;
  pSVar14->pLeftmost = (SegmentNode *)0x0;
  *(undefined8 *)&pSVar14->nEntry = 0;
  pSVar14->pParent = (SegmentNode *)0x0;
  pSVar14->pRight = (SegmentNode *)0x0;
  pSVar14->nData = 0xb;
  pSVar14->aData = (char *)(pSVar14 + 1);
  local_40 = pSVar14;
  if (pSVar2 == (SegmentNode *)0x0) {
    pSVar14->pLeftmost = pSVar14;
    iVar8 = fts3NodeAddTerm(p,&local_40,isCopyTerm,zTerm,iVar15);
  }
  else {
    local_38 = pSVar2->pParent;
    iVar8 = fts3NodeAddTerm(p,&local_38,isCopyTerm,zTerm,iVar15);
    if (pSVar2->pParent == (SegmentNode *)0x0) {
      pSVar2->pParent = local_38;
    }
    pSVar2->pRight = pSVar14;
    pSVar14->pLeftmost = pSVar2->pLeftmost;
    pSVar14->pParent = local_38;
    pSVar14->zMalloc = pSVar2->zMalloc;
    pSVar14->nMalloc = pSVar2->nMalloc;
    pSVar2->zMalloc = (char *)0x0;
    local_40 = pSVar14;
  }
  *ppTree = local_40;
  return iVar8;
}

Assistant:

static int fts3NodeAddTerm(
  Fts3Table *p,                   /* Virtual table handle */
  SegmentNode **ppTree,           /* IN/OUT: SegmentNode handle */ 
  int isCopyTerm,                 /* True if zTerm/nTerm is transient */
  const char *zTerm,              /* Pointer to buffer containing term */
  int nTerm                       /* Size of term in bytes */
){
  SegmentNode *pTree = *ppTree;
  int rc;
  SegmentNode *pNew;

  /* First try to append the term to the current node. Return early if 
  ** this is possible.
  */
  if( pTree ){
    int nData = pTree->nData;     /* Current size of node in bytes */
    int nReq = nData;             /* Required space after adding zTerm */
    int nPrefix;                  /* Number of bytes of prefix compression */
    int nSuffix;                  /* Suffix length */

    nPrefix = fts3PrefixCompress(pTree->zTerm, pTree->nTerm, zTerm, nTerm);
    nSuffix = nTerm-nPrefix;

    nReq += sqlite3Fts3VarintLen(nPrefix)+sqlite3Fts3VarintLen(nSuffix)+nSuffix;
    if( nReq<=p->nNodeSize || !pTree->zTerm ){

      if( nReq>p->nNodeSize ){
        /* An unusual case: this is the first term to be added to the node
        ** and the static node buffer (p->nNodeSize bytes) is not large
        ** enough. Use a separately malloced buffer instead This wastes
        ** p->nNodeSize bytes, but since this scenario only comes about when
        ** the database contain two terms that share a prefix of almost 2KB, 
        ** this is not expected to be a serious problem. 
        */
        assert( pTree->aData==(char *)&pTree[1] );
        pTree->aData = (char *)sqlite3_malloc(nReq);
        if( !pTree->aData ){
          return SQLITE_NOMEM;
        }
      }

      if( pTree->zTerm ){
        /* There is no prefix-length field for first term in a node */
        nData += sqlite3Fts3PutVarint(&pTree->aData[nData], nPrefix);
      }

      nData += sqlite3Fts3PutVarint(&pTree->aData[nData], nSuffix);
      memcpy(&pTree->aData[nData], &zTerm[nPrefix], nSuffix);
      pTree->nData = nData + nSuffix;
      pTree->nEntry++;

      if( isCopyTerm ){
        if( pTree->nMalloc<nTerm ){
          char *zNew = sqlite3_realloc(pTree->zMalloc, nTerm*2);
          if( !zNew ){
            return SQLITE_NOMEM;
          }
          pTree->nMalloc = nTerm*2;
          pTree->zMalloc = zNew;
        }
        pTree->zTerm = pTree->zMalloc;
        memcpy(pTree->zTerm, zTerm, nTerm);
        pTree->nTerm = nTerm;
      }else{
        pTree->zTerm = (char *)zTerm;
        pTree->nTerm = nTerm;
      }
      return SQLITE_OK;
    }
  }

  /* If control flows to here, it was not possible to append zTerm to the
  ** current node. Create a new node (a right-sibling of the current node).
  ** If this is the first node in the tree, the term is added to it.
  **
  ** Otherwise, the term is not added to the new node, it is left empty for
  ** now. Instead, the term is inserted into the parent of pTree. If pTree 
  ** has no parent, one is created here.
  */
  pNew = (SegmentNode *)sqlite3_malloc(sizeof(SegmentNode) + p->nNodeSize);
  if( !pNew ){
    return SQLITE_NOMEM;
  }
  memset(pNew, 0, sizeof(SegmentNode));
  pNew->nData = 1 + FTS3_VARINT_MAX;
  pNew->aData = (char *)&pNew[1];

  if( pTree ){
    SegmentNode *pParent = pTree->pParent;
    rc = fts3NodeAddTerm(p, &pParent, isCopyTerm, zTerm, nTerm);
    if( pTree->pParent==0 ){
      pTree->pParent = pParent;
    }
    pTree->pRight = pNew;
    pNew->pLeftmost = pTree->pLeftmost;
    pNew->pParent = pParent;
    pNew->zMalloc = pTree->zMalloc;
    pNew->nMalloc = pTree->nMalloc;
    pTree->zMalloc = 0;
  }else{
    pNew->pLeftmost = pNew;
    rc = fts3NodeAddTerm(p, &pNew, isCopyTerm, zTerm, nTerm); 
  }

  *ppTree = pNew;
  return rc;
}